

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginOperator.cpp
# Opt level: O3

size_t __thiscall
adios2::plugin::PluginOperator::GetEstimatedSize
          (PluginOperator *this,size_t ElemCount,size_t ElemSize,size_t ndims,size_t *dims)

{
  _Rb_tree_node_base *p_Var1;
  Impl *pIVar2;
  _Base_ptr p_Var3;
  _Rb_tree_node_base *p_Var4;
  Params *__range2;
  long lVar5;
  long lVar6;
  undefined1 *puVar7;
  
  pIVar2 = (this->m_Impl)._M_t.
           super___uniq_ptr_impl<adios2::plugin::PluginOperator::Impl,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           ._M_t.
           super__Tuple_impl<0UL,_adios2::plugin::PluginOperator::Impl_*,_std::default_delete<adios2::plugin::PluginOperator::Impl>_>
           .super__Head_base<0UL,_adios2::plugin::PluginOperator::Impl_*,_false>._M_head_impl;
  p_Var4 = *(_Base_ptr *)((long)&(pIVar2->m_PluginParams)._M_t + 0x18);
  p_Var1 = (_Rb_tree_node_base *)((long)&(pIVar2->m_PluginParams)._M_t + 8);
  if (p_Var4 == p_Var1) {
    puVar7 = (undefined1 *)0x5;
  }
  else {
    lVar5 = 1;
    do {
      p_Var3 = p_Var4[2]._M_parent;
      lVar6 = (long)&(p_Var4[1]._M_parent)->_M_color + lVar5;
      lVar5 = (long)&p_Var3->_M_color + lVar6 + 2;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var1);
    puVar7 = &p_Var3->field_0x6 + lVar6;
  }
  lVar5 = (**(code **)((long)(pIVar2->m_Plugin->super_Operator)._vptr_Operator + 0x98))
                    (pIVar2->m_Plugin,ElemCount,ElemSize,ndims,dims);
  return (size_t)(puVar7 + lVar5);
}

Assistant:

size_t PluginOperator::GetEstimatedSize(const size_t ElemCount, const size_t ElemSize,
                                        const size_t ndims, const size_t *dims) const
{
    // Need to calculate the size of the header written by Operate and then add our plugin's size.
    constexpr size_t commonHeaderSize =
        sizeof(m_TypeEnum) + sizeof(std::uint8_t) + sizeof(std::uint16_t);

    auto &pp = m_Impl->m_PluginParams;
    // Want to use std::transform_reduce but C++11
    size_t paramsSize = 1; // for the number of parameters
    for (auto &&p : pp)
    {
        // Need length and string for key and values.
        paramsSize += p.first.size() + p.second.size() + 2;
    }

    // Plugin's estimate of size so it doesn't need to know about headers.
    auto implSize = m_Impl->m_Plugin->GetEstimatedSize(ElemCount, ElemSize, ndims, dims);

    return commonHeaderSize + paramsSize + implSize;
}